

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodePredicateOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint in_ESI;
  MCInst *in_RDI;
  undefined4 local_4;
  
  if (in_ESI == 0xf) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar1 = MCInst_getOpcode(in_RDI);
    if ((uVar1 == 0xaa3) && (in_ESI == 0xe)) {
      local_4 = MCDisassembler_Fail;
    }
    else {
      MCOperand_CreateImm0(in_RDI,(ulong)in_ESI);
      if (in_ESI == 0xe) {
        MCOperand_CreateReg0(in_RDI,0);
      }
      else {
        MCOperand_CreateReg0(in_RDI,3);
      }
      local_4 = MCDisassembler_Success;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodePredicateOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	if (Val == 0xF) return MCDisassembler_Fail;
	// AL predicate is not allowed on Thumb1 branches.
	if (MCInst_getOpcode(Inst) == ARM_tBcc && Val == 0xE)
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, Val);
	if (Val == ARMCC_AL) {
		MCOperand_CreateReg0(Inst, 0);
	} else
		MCOperand_CreateReg0(Inst, ARM_CPSR);
	return MCDisassembler_Success;
}